

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void pay_for_damage(char *dmgstr,boolean cant_mollify)

{
  char x;
  char y;
  boolean bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *__src;
  monst *pmVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  damage *pdVar11;
  int local_cc;
  uint local_c8;
  uint local_c4;
  damage *local_b8;
  monst *local_b0;
  char shops_affected [5];
  char qbuf [80];
  
  cVar2 = u.ushops[0];
  iVar3 = strcmp(dmgstr,"dig into");
  if (iVar3 == 0) {
    pcVar9 = "shop";
  }
  else {
    iVar3 = strcmp(dmgstr,"damage");
    pcVar9 = "door";
    if (iVar3 == 0) {
      pcVar9 = "shop";
    }
  }
  pdVar11 = (damage *)&level->damagelist;
  lVar8 = 0;
  local_c4 = 7000;
  local_c8 = 7000;
  local_cc = 0;
  local_b8 = (damage *)0x0;
  local_b0 = (monst *)0x0;
  do {
    do {
      pdVar11 = pdVar11->next;
      if ((pdVar11 == (damage *)0x0) || (pdVar11->when != (ulong)moves)) {
        if (lVar8 == 0) {
          return;
        }
        if (local_b0 == (monst *)0x0) {
          return;
        }
        x = (local_b8->place).x;
        y = (local_b8->place).y;
        strncpy(&local_b0[0x1b].field_0x75,plname,0x20);
        if (((local_b0->field_0x62 & 0x40) == 0) ||
           (*(char *)((long)&local_b0[0x1b].meating + 1) != '\0')) goto LAB_002315af;
        pcVar10 = in_rooms(level,local_b0->mx,local_b0->my,0x12);
        if (*pcVar10 == '\0') {
          if ((viz_array[local_b0->my][local_b0->mx] & 2U) == 0) {
            return;
          }
LAB_002313a8:
          pcVar10 = "How dare you %s my %s?";
        }
        else {
          if (cVar2 == '\0') {
            pmVar6 = level->monsters[x][y];
            if (((pmVar6 != (monst *)0x0) && ((pmVar6->field_0x61 & 2) == 0)) &&
               (flags.soundok != '\0')) {
              You_hear("an angry voice:");
              verbalize("Out of my way, scum!");
            }
            mnearto(local_b0,x,y,'\x01');
          }
          else {
            bVar1 = um_dist(local_b0->mx,local_b0->my,'\x01');
            if ((bVar1 != '\0') &&
               (bVar1 = um_dist(local_b0->mx,local_b0->my,'\x03'), bVar1 == '\0')) {
              pline("%s leaps towards you!",(undefined1 *)((long)&local_b0[0x1c].minvent + 5));
              mnexto(local_b0);
            }
            bVar1 = um_dist(local_b0->mx,local_b0->my,'\x01');
            if (bVar1 != '\0') goto LAB_002313a8;
          }
          bVar1 = um_dist(x,y,'\x01');
          if (((cant_mollify == '\0') && (bVar1 == '\0' || cVar2 != '\0')) &&
             ((lVar7 = money_cnt(invent), lVar8 <= (int)local_b0[0x1b].mappearance + lVar7 &&
              (uVar4 = mt_random(), uVar4 % 0x32 != 0)))) {
            if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                 (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
               (u.uprops[0xd].blocked == 0)) {
              pline("Your invisibility does not fool %s!",
                    (undefined1 *)((long)&local_b0[0x1c].minvent + 5));
            }
            pcVar9 = currency(lVar8);
            sprintf(qbuf,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",lVar8,pcVar9);
            cVar2 = yn_function(qbuf,"yn",'n');
            if (cVar2 == 'n') {
              verbalize("Oh, yes!  You\'ll pay!");
              hot_pursuit(local_b0);
              iVar3 = sgn((int)u.ualign.type);
              adjalign(-iVar3);
              return;
            }
            lVar8 = check_credit(lVar8,local_b0);
            money2mon(local_b0,lVar8);
            iflags.botl = '\x01';
            pline("Mollified, %s accepts your restitution.");
            home_shk(local_b0,'\0');
            pacify_shk(local_b0);
            return;
          }
          bVar1 = um_dist(x,y,'\x01');
          if (bVar1 == '\0' || cVar2 != '\0') {
            pcVar10 = "How dare you %s my %s?";
          }
          else {
            pline("%s shouts:",(undefined1 *)((long)&local_b0[0x1c].minvent + 5));
            pcVar10 = "Who dared %s my %s?";
          }
        }
        verbalize(pcVar10,dmgstr,pcVar9);
LAB_002315af:
        hot_pursuit(local_b0);
        return;
      }
      lVar7 = pdVar11->cost;
    } while (lVar7 == 0);
    __src = in_rooms(level,(pdVar11->place).x,(pdVar11->place).y,0x12);
    pcVar10 = shops_affected;
    strcpy(pcVar10,__src);
    for (; *pcVar10 != '\0'; pcVar10 = pcVar10 + 1) {
      pmVar6 = shop_keeper(level,*pcVar10);
      if (pmVar6 != (monst *)0x0) {
        if (pmVar6 == local_b0) {
          uVar4 = dist2((int)(pdVar11->place).x,(int)(pdVar11->place).y,(int)u.ux,(int)u.uy);
          if (uVar4 < local_c8) {
            local_c8 = uVar4;
            local_b8 = pdVar11;
          }
        }
        else {
          iVar3 = inhishop(pmVar6);
          if (iVar3 != 0) {
            uVar4 = dist2((int)pmVar6->mx,(int)pmVar6->my,(int)u.ux,(int)u.uy);
            if (uVar4 <= local_c4) {
              iVar3 = 1;
              if (local_cc != 0 && uVar4 == local_c4) {
                iVar3 = local_cc + 1;
                iVar5 = rn2(iVar3);
                local_cc = iVar3;
                if (iVar5 != 0) goto LAB_00231275;
              }
              local_c8 = dist2((int)(pdVar11->place).x,(int)(pdVar11->place).y,(int)u.ux,(int)u.uy);
              local_cc = iVar3;
              local_c4 = uVar4;
              local_b8 = pdVar11;
              local_b0 = pmVar6;
            }
          }
        }
      }
LAB_00231275:
    }
    lVar8 = lVar8 + lVar7;
  } while( true );
}

Assistant:

void pay_for_damage(const char *dmgstr, boolean cant_mollify)
{
	struct monst *shkp = NULL;
	char shops_affected[5];
	boolean uinshp = (*u.ushops != '\0');
	char qbuf[80];
	xchar x, y;
	boolean dugwall = !strcmp(dmgstr, "dig into") ||	/* wand */
			  !strcmp(dmgstr, "damage");		/* pick-axe */
	struct damage *tmp_dam, *appear_here = 0;
	/* any number >= (80*80)+(24*24) would do, actually */
	long cost_of_damage = 0L;
	unsigned int nearest_shk = 7000, nearest_damage = 7000;
	int picks = 0;

	for (tmp_dam = level->damagelist;
	     (tmp_dam && (tmp_dam->when == moves));
	     tmp_dam = tmp_dam->next) {
	    char *shp;

	    if (!tmp_dam->cost)
		continue;
	    cost_of_damage += tmp_dam->cost;
	    strcpy(shops_affected,
		   in_rooms(level, tmp_dam->place.x, tmp_dam->place.y, SHOPBASE));
	    for (shp = shops_affected; *shp; shp++) {
		struct monst *tmp_shk;
		unsigned int shk_distance;

		if (!(tmp_shk = shop_keeper(level, *shp)))
		    continue;
		if (tmp_shk == shkp) {
		    unsigned int damage_distance =
				   distu(tmp_dam->place.x, tmp_dam->place.y);

		    if (damage_distance < nearest_damage) {
			nearest_damage = damage_distance;
			appear_here = tmp_dam;
		    }
		    continue;
		}
		if (!inhishop(tmp_shk))
		    continue;
		shk_distance = distu(tmp_shk->mx, tmp_shk->my);
		if (shk_distance > nearest_shk)
		    continue;
		if ((shk_distance == nearest_shk) && picks) {
		    if (rn2(++picks))
			continue;
		} else
		    picks = 1;
		shkp = tmp_shk;
		nearest_shk = shk_distance;
		appear_here = tmp_dam;
		nearest_damage = distu(tmp_dam->place.x, tmp_dam->place.y);
	    }
	}

	if (!cost_of_damage || !shkp)
	    return;

	x = appear_here->place.x;
	y = appear_here->place.y;

	/* not the best introduction to the shk... */
	strncpy(ESHK(shkp)->customer,plname,PL_NSIZ);

	/* if the shk is already on the war path, be sure it's all out */
	if (ANGRY(shkp) || ESHK(shkp)->following) {
		hot_pursuit(shkp);
		return;
	}

	/* if the shk is not in their shop.. */
	if (!*in_rooms(level, shkp->mx,shkp->my,SHOPBASE)) {
		if (!cansee(shkp->mx, shkp->my))
			return;
		goto getcad;
	}

	if (uinshp) {
		if (um_dist(shkp->mx, shkp->my, 1) &&
			!um_dist(shkp->mx, shkp->my, 3)) {
		    pline("%s leaps towards you!", shkname(shkp));
		    mnexto(shkp);
		}
		if (um_dist(shkp->mx, shkp->my, 1)) goto getcad;
	} else {
	    /*
	     * Make shkp show up at the door.  Effect:  If there is a monster
	     * in the doorway, have the hero hear the shopkeeper yell a bit,
	     * pause, then have the shopkeeper appear at the door, having
	     * yanked the hapless critter out of the way.
	     */
	    if (MON_AT(level, x, y)) {
		if (flags.soundok) {
		    You_hear("an angry voice:");
		    verbalize("Out of my way, scum!");
		}
	    }
	    mnearto(shkp, x, y, TRUE);
	}

	if ((um_dist(x, y, 1) && !uinshp) || cant_mollify ||
	   (money_cnt(invent) + ESHK(shkp)->credit) < cost_of_damage || !rn2(50)) {
		if (um_dist(x, y, 1) && !uinshp) {
		    pline("%s shouts:", shkname(shkp));
		    verbalize("Who dared %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		} else {
getcad:
		    verbalize("How dare you %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		}
		hot_pursuit(shkp);
		return;
	}

	if (Invis) pline("Your invisibility does not fool %s!", shkname(shkp));
	sprintf(qbuf,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",
		 cost_of_damage, currency(cost_of_damage));
	if (yn(qbuf) != 'n') {
		cost_of_damage = check_credit(cost_of_damage, shkp);
                money2mon(shkp, cost_of_damage);
		iflags.botl = 1;
		pline("Mollified, %s accepts your restitution.",
			shkname(shkp));
		/* move shk back to his home loc */
		home_shk(shkp, FALSE);
		pacify_shk(shkp);
	} else {
		verbalize("Oh, yes!  You'll pay!");
		hot_pursuit(shkp);
		adjalign(-sgn(u.ualign.type));
	}
}